

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_short_radix(char *str,size_t n,void *dest,int radix)

{
  bool bVar1;
  short *in_RDX;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  long r;
  undefined8 local_30;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = parse_long_radix((char *)r,unaff_retaddr,
                           (void *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    if ((short)local_30 == local_30) {
      if (in_RDX == (short *)0x0) {
        bVar1 = true;
      }
      else {
        *in_RDX = (short)local_30;
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RE2::Arg::parse_short_radix(const char* str,
                                 size_t n,
                                 void* dest,
                                 int radix) {
  long r;
  if (!parse_long_radix(str, n, &r, radix)) return false;  // Could not parse
  if ((short)r != r) return false;                         // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<short*>(dest)) = (short)r;
  return true;
}